

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O2

QFbScreen * __thiscall QFbScreen::doRedraw(QFbScreen *this)

{
  QRect *pQVar1;
  QList<QFbWindow_*> *this_00;
  undefined4 uVar2;
  ulong uVar3;
  QFbBackingStore *this_01;
  undefined4 uVar4;
  GlobalColor c;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  char cVar7;
  QPainter *pQVar8;
  QBasicAtomicPointer<QMutexPrivate> *pQVar9;
  QBasicAtomicPointer<QMutexPrivate> *pQVar10;
  pointer ppQVar11;
  int iVar12;
  long lVar13;
  long in_RSI;
  long in_FS_OFFSET;
  QRect QVar14;
  undefined1 local_80 [24];
  QRect local_68;
  undefined1 local_58 [16];
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = *(ulong *)(in_RSI + 0x50);
  *(undefined8 *)this = 0xaaaaaaaaaaaaaaaa;
  QRegion::QRegion((QRegion *)this);
  if (((*(long **)(in_RSI + 0x48) != (long *)0x0) &&
      (cVar7 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xa8))(), cVar7 != '\0')) &&
     (cVar7 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xb0))(), cVar7 != '\0')) {
    local_80._0_16_ = (undefined1  [16])QFbCursor::dirtyRect(*(QFbCursor **)(in_RSI + 0x48));
    QRegion::operator+=((QRegion *)(in_RSI + 0x38),(QRect *)local_80);
  }
  pQVar1 = (QRect *)(in_RSI + 0x38);
  cVar7 = QRegion::isEmpty();
  QVar14.x2.m_i = local_58._8_4_;
  QVar14.y2.m_i = local_58._12_4_;
  QVar14.x1.m_i = local_58._0_4_;
  QVar14.y1.m_i = local_58._4_4_;
  if (cVar7 != '\0') {
    if (*(long **)(in_RSI + 0x48) == (long *)0x0) goto LAB_00113e9f;
    cVar7 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xa8))();
    QVar14.x2.m_i = local_58._8_4_;
    QVar14.y2.m_i = local_58._12_4_;
    QVar14.x1.m_i = local_58._0_4_;
    QVar14.y1.m_i = local_58._4_4_;
    if (cVar7 == '\0') goto LAB_00113e9f;
  }
  if (*(long *)(in_RSI + 0x90) == 0) {
    pQVar8 = (QPainter *)operator_new(8);
    QPainter::QPainter(pQVar8,(QPaintDevice *)(in_RSI + 0x78));
    *(QPainter **)(in_RSI + 0x90) = pQVar8;
  }
  lVar13 = (ulong)(uint)-(int)uVar3 - (uVar3 & 0xffffffff00000000);
  local_80._0_8_ = lVar13;
  local_48 = QRect::translated((QRect *)(in_RSI + 0x50),(QPoint *)local_80);
  pQVar9 = (QBasicAtomicPointer<QMutexPrivate> *)QRegion::begin();
  pQVar10 = (QBasicAtomicPointer<QMutexPrivate> *)QRegion::end();
  this_00 = (QList<QFbWindow_*> *)(in_RSI + 0x20);
  for (; pQVar9 != pQVar10; pQVar9 = pQVar9 + 2) {
    local_58._0_8_ = pQVar9->_q_value;
    local_58._8_8_ = pQVar9[1]._q_value;
    local_58 = QRect::operator&((QRect *)local_58,&local_48);
    if ((local_58._0_4_ <= local_58._8_4_) && (local_58._4_4_ <= local_58._12_4_)) {
      QPainter::setCompositionMode((CompositionMode)*(undefined8 *)(in_RSI + 0x90));
      pQVar8 = *(QPainter **)(in_RSI + 0x90);
      cVar7 = QImage::hasAlphaChannel();
      c = black;
      if (cVar7 != '\0') {
        c = transparent;
      }
      QPainter::fillRect(pQVar8,(QRect *)local_58,c);
      iVar12 = *(int *)(in_RSI + 0x30);
      while( true ) {
        iVar12 = iVar12 + -1;
        if (iVar12 == -1) break;
        QList<QFbWindow_*>::data(this_00);
        QPlatformWindow::window();
        cVar7 = QWindow::isVisible();
        if (cVar7 != '\0') {
          ppQVar11 = QList<QFbWindow_*>::data(this_00);
          local_80._0_16_ = (**(code **)(*(long *)ppQVar11[iVar12] + 0x30))();
          local_68._0_8_ = lVar13;
          QVar14 = QRect::translated((QRect *)local_80,(QPoint *)&local_68);
          local_68.x2.m_i = -0x55555556;
          local_68.y2.m_i = -0x55555556;
          local_68.x1.m_i = -0x55555556;
          local_68.y1.m_i = -0x55555556;
          local_68 = QRect::translated((QRect *)local_58,-QVar14.x1.m_i.m_i,-QVar14.y1.m_i.m_i);
          ppQVar11 = QList<QFbWindow_*>::data(this_00);
          this_01 = ppQVar11[iVar12]->mBackingStore;
          if (this_01 != (QFbBackingStore *)0x0) {
            QFbBackingStore::lock(this_01);
            pQVar8 = *(QPainter **)(in_RSI + 0x90);
            QFbBackingStore::image((QFbBackingStore *)local_80);
            QPainter::drawImage(pQVar8,(QRect *)local_58,(QImage *)local_80,&local_68,
                                (ImageConversionFlags)0x0);
            QImage::~QImage((QImage *)local_80);
            QFbBackingStore::unlock(this_01);
          }
        }
      }
    }
  }
  if (*(long **)(in_RSI + 0x48) != (long *)0x0) {
    cVar7 = (**(code **)(**(long **)(in_RSI + 0x48) + 0xa8))();
    if (cVar7 == '\0') {
      local_80._0_16_ = (**(code **)(**(long **)(in_RSI + 0x48) + 0xb8))();
      cVar7 = QRegion::intersects(pQVar1);
      if (cVar7 == '\0') goto LAB_00113e73;
    }
    QPainter::setCompositionMode((CompositionMode)*(undefined8 *)(in_RSI + 0x90));
    local_80._0_16_ =
         (**(code **)(**(long **)(in_RSI + 0x48) + 0x98))
                   (*(long **)(in_RSI + 0x48),*(undefined8 *)(in_RSI + 0x90));
    QRegion::operator+=((QRegion *)this,(QRect *)local_80);
  }
LAB_00113e73:
  QRegion::operator+=((QRegion *)this,(QRegion *)pQVar1);
  QRegion::QRegion((QRegion *)local_80);
  auVar6 = local_80._0_16_;
  uVar2 = pQVar1->x1;
  uVar4 = pQVar1->y1;
  local_80._4_4_ = uVar4;
  local_80._0_4_ = uVar2;
  uVar5 = local_80._0_8_;
  local_80._0_8_ = auVar6._0_8_;
  pQVar1->x1 = (Representation)local_80._0_4_;
  pQVar1->y1 = (Representation)local_80._4_4_;
  local_80._8_8_ = auVar6._8_8_;
  local_80._0_16_ = CONCAT88(local_80._8_8_,uVar5);
  QRegion::~QRegion((QRegion *)local_80);
  QVar14 = (QRect)local_58;
LAB_00113e9f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    local_58 = (undefined1  [16])QVar14;
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QRegion QFbScreen::doRedraw()
{
    const QPoint screenOffset = mGeometry.topLeft();

    QRegion touchedRegion;
    if (mCursor && mCursor->isDirty() && mCursor->isOnScreen()) {
        const QRect lastCursor = mCursor->dirtyRect();
        mRepaintRegion += lastCursor;
    }
    if (mRepaintRegion.isEmpty() && (!mCursor || !mCursor->isDirty()))
        return touchedRegion;

    if (!mPainter)
        mPainter = new QPainter(&mScreenImage);

    const QRect screenRect = mGeometry.translated(-screenOffset);
    for (QRect rect : mRepaintRegion) {
        rect = rect.intersected(screenRect);
        if (rect.isEmpty())
            continue;

        mPainter->setCompositionMode(QPainter::CompositionMode_Source);
        mPainter->fillRect(rect, mScreenImage.hasAlphaChannel() ? Qt::transparent : Qt::black);

        for (int layerIndex = mWindowStack.size() - 1; layerIndex != -1; layerIndex--) {
            if (!mWindowStack[layerIndex]->window()->isVisible())
                continue;

            const QRect windowRect = mWindowStack[layerIndex]->geometry().translated(-screenOffset);
            const QRect windowIntersect = rect.translated(-windowRect.left(), -windowRect.top());
            QFbBackingStore *backingStore = mWindowStack[layerIndex]->backingStore();
            if (backingStore) {
                backingStore->lock();
                mPainter->drawImage(rect, backingStore->image(), windowIntersect);
                backingStore->unlock();
            }
        }
    }

    if (mCursor && (mCursor->isDirty() || mRepaintRegion.intersects(mCursor->lastPainted()))) {
        mPainter->setCompositionMode(QPainter::CompositionMode_SourceOver);
        touchedRegion += mCursor->drawCursor(*mPainter);
    }
    touchedRegion += mRepaintRegion;
    mRepaintRegion = QRegion();

    return touchedRegion;
}